

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaReadVer.c
# Opt level: O0

Cba_Man_t * Prs_ManBuildCbaVerilog(char *pFileName,Vec_Ptr_t *vDes)

{
  int iVar1;
  int nIns;
  int nOuts;
  int nObjs;
  Prs_Ntk_t *pPVar2;
  Abc_Nam_t *pStrs_00;
  Abc_Nam_t *pFuns_00;
  Abc_Nam_t *pMods_00;
  Hash_IntMan_t *vHash;
  Cba_Man_t *p_00;
  char *pcVar3;
  Cba_Ntk_t *pCVar4;
  Cba_Ntk_t *pNtk;
  Cba_Man_t *p;
  Abc_Nam_t *pMods;
  Abc_Nam_t *pFuns;
  Abc_Nam_t *pStrs;
  Prs_Ntk_t *pPrsRoot;
  int fError;
  int i;
  Prs_Ntk_t *pPrsNtk;
  Vec_Ptr_t *vDes_local;
  char *pFileName_local;
  
  pPrsRoot._0_4_ = 0;
  pPVar2 = Prs_ManRoot(vDes);
  pStrs_00 = Abc_NamRef(pPVar2->pStrs);
  pFuns_00 = Abc_NamRef(pPVar2->pFuns);
  pMods_00 = Abc_NamStart(100,0x18);
  iVar1 = Vec_PtrSize(vDes);
  vHash = Hash_IntManRef(pPVar2->vHash);
  p_00 = Cba_ManAlloc(pFileName,iVar1,pStrs_00,pFuns_00,pMods_00,vHash);
  for (pPrsRoot._4_4_ = 0; iVar1 = Vec_PtrSize(vDes), pPrsRoot._4_4_ < iVar1;
      pPrsRoot._4_4_ = pPrsRoot._4_4_ + 1) {
    pPVar2 = (Prs_Ntk_t *)Vec_PtrEntry(vDes,pPrsRoot._4_4_);
    iVar1 = Prs_NtkId(pPVar2);
    nIns = Prs_NtkPiNum(pPVar2);
    nOuts = Prs_NtkPoNum(pPVar2);
    nObjs = Prs_NtkObjNum(pPVar2);
    pCVar4 = Cba_NtkAlloc(p_00,iVar1,nIns,nOuts,nObjs,100,100);
    Prs_CreateVerilogPio(pCVar4,pPVar2);
    Cba_NtkAdd(p_00,pCVar4);
  }
  for (pPrsRoot._4_4_ = 0; iVar1 = Vec_PtrSize(vDes), pPrsRoot._4_4_ < iVar1;
      pPrsRoot._4_4_ = pPrsRoot._4_4_ + 1) {
    pPVar2 = (Prs_Ntk_t *)Vec_PtrEntry(vDes,pPrsRoot._4_4_);
    pcVar3 = Prs_NtkName(pPVar2);
    printf("Building module \"%s\"...\n",pcVar3);
    pCVar4 = Cba_ManNtk(p_00,pPrsRoot._4_4_ + 1);
    pPrsRoot._0_4_ = Prs_CreateVerilogNtk(pCVar4,pPVar2);
    if ((int)pPrsRoot != 0) break;
  }
  if ((int)pPrsRoot == 0) {
    Cba_ManPrepareSeq(p_00);
  }
  else {
    printf("Quitting because of errors.\n");
  }
  return p_00;
}

Assistant:

Cba_Man_t * Prs_ManBuildCbaVerilog( char * pFileName, Vec_Ptr_t * vDes )
{
    Prs_Ntk_t * pPrsNtk; int i, fError = 0;
    Prs_Ntk_t * pPrsRoot = Prs_ManRoot(vDes);
    // start the manager
    Abc_Nam_t * pStrs = Abc_NamRef(pPrsRoot->pStrs);
    Abc_Nam_t * pFuns = Abc_NamRef(pPrsRoot->pFuns);
    Abc_Nam_t * pMods = Abc_NamStart( 100, 24 );
    Cba_Man_t * p = Cba_ManAlloc( pFileName, Vec_PtrSize(vDes), pStrs, pFuns, pMods, Hash_IntManRef(pPrsRoot->vHash) );
    // initialize networks
    Vec_PtrForEachEntry( Prs_Ntk_t *, vDes, pPrsNtk, i )
    {
        Cba_Ntk_t * pNtk = Cba_NtkAlloc( p, Prs_NtkId(pPrsNtk), Prs_NtkPiNum(pPrsNtk), Prs_NtkPoNum(pPrsNtk), Prs_NtkObjNum(pPrsNtk), 100, 100 );
        Prs_CreateVerilogPio( pNtk, pPrsNtk );
        Cba_NtkAdd( p, pNtk );
    }
    // create networks
    Vec_PtrForEachEntry( Prs_Ntk_t *, vDes, pPrsNtk, i )
    {
        printf( "Building module \"%s\"...\n", Prs_NtkName(pPrsNtk) );
        fError = Prs_CreateVerilogNtk( Cba_ManNtk(p, i+1), pPrsNtk );
        if ( fError )
            break;
    }
    if ( fError )
        printf( "Quitting because of errors.\n" );
    else
        Cba_ManPrepareSeq( p );
    return p;
}